

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  size_t sVar1;
  xmlChar xVar2;
  xmlParserInputState xVar3;
  getParameterEntitySAXFunc p_Var4;
  xmlGenericErrorFunc p_Var5;
  getEntitySAXFunc p_Var6;
  byte *str_00;
  xmlEntityPtr pxVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  xmlEntityType xVar11;
  xmlChar *pxVar12;
  int *piVar13;
  xmlGenericErrorFunc *pp_Var14;
  void **ppvVar15;
  xmlEntityPtr pxVar16;
  xmlBufferPtr buf;
  xmlParserInputPtr input;
  xmlChar *pxVar17;
  xmlParserInputPtr pxVar18;
  char *pcVar19;
  xmlChar *pxVar20;
  xmlParserErrors error;
  undefined7 in_register_00000081;
  xmlChar *str2;
  xmlChar *pxVar21;
  long lVar22;
  ulong uVar23;
  xmlChar *pxVar24;
  bool bVar25;
  bool bVar26;
  int l;
  size_t local_80;
  ulong local_68;
  xmlChar *local_60;
  uint local_58;
  int local_54;
  xmlParserCtxtPtr local_50;
  uint local_48;
  uint local_44;
  xmlEntityPtr local_40;
  xmlChar *local_38;
  
  str2 = (xmlChar *)CONCAT71(in_register_00000081,end);
  if (-1 < len && (str != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) {
    local_58 = what;
    if ((0x28 < ctxt->depth) && ((0x400 < (uint)ctxt->depth || ((ctxt->options & 0x80000U) == 0))))
    {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      return (xmlChar *)0x0;
    }
    pxVar12 = (xmlChar *)(*xmlMallocAtomic)(300);
    uVar9 = 0;
    pxVar20 = (xmlChar *)0x0;
    if (pxVar12 != (xmlChar *)0x0) {
      local_50 = ctxt;
      if (len != 0) {
        uVar9 = xmlStringCurrentChar(ctxt,str,&local_54);
      }
      local_80 = 0;
      local_44 = (uint)end3;
      if ((((uVar9 != local_44) && (uVar9 != end2)) && (uVar9 != 0)) &&
         (local_48 = (uint)end, uVar9 != local_48)) {
        local_38 = str + (uint)len;
        local_68 = 300;
        local_80 = 0;
        ctxt = local_50;
        pxVar24 = pxVar12;
        while (pxVar12 = pxVar24, ctxt->instate != XML_PARSER_EOF) {
          if (uVar9 == 0x26) {
            if (str[1] == '#') {
              if (*str != '&') {
                xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
                goto LAB_00156cfa;
              }
              pxVar20 = str + 2;
              bVar8 = str[2];
              lVar22 = 1;
              if (bVar8 == 0x3b) {
                uVar9 = 0;
LAB_001562c0:
                str = pxVar20 + lVar22;
              }
              else {
                if (bVar8 != 0x78) {
                  uVar9 = 0;
                  do {
                    if (9 < (byte)(bVar8 - 0x30)) {
                      lVar22 = 0;
                      xmlFatalErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,(char *)0x0);
                      uVar9 = 0;
                      break;
                    }
                    uVar9 = ((uint)bVar8 + uVar9 * 10) - 0x30;
                    if (0x10ffff < (int)uVar9) {
                      uVar9 = 0x110000;
                    }
                    bVar8 = pxVar20[1];
                    pxVar20 = pxVar20 + 1;
                  } while (bVar8 != 0x3b);
                  goto LAB_001562c0;
                }
                bVar8 = str[3];
                pxVar20 = str + 3;
                uVar9 = 0;
                if (bVar8 != 0x3b) {
                  uVar9 = 0;
                  do {
                    if ((byte)(bVar8 - 0x30) < 10) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x30;
                    }
                    else if ((byte)(bVar8 + 0x9f) < 6) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x57;
                    }
                    else {
                      if (5 < (byte)(bVar8 + 0xbf)) {
                        lVar22 = 0;
                        xmlFatalErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,(char *)0x0);
                        uVar9 = 0;
                        break;
                      }
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x37;
                    }
                    if (0x10ffff < (int)uVar9) {
                      uVar9 = 0x110000;
                    }
                    bVar8 = pxVar20[1];
                    pxVar20 = pxVar20 + 1;
                  } while (bVar8 != 0x3b);
                }
                str = pxVar20 + lVar22;
              }
              if (0x10ffff < (int)uVar9) {
                pcVar19 = "xmlParseStringCharRef: character reference out of bounds\n";
LAB_00156d78:
                xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,pcVar19,uVar9);
                goto LAB_00156cfa;
              }
              if ((int)uVar9 < 0x100) {
                if (((int)uVar9 < 0x20) && ((0xd < uVar9 || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0)))
                   ) {
LAB_00156d71:
                  pcVar19 = "xmlParseStringCharRef: invalid xmlChar value %d\n";
                  goto LAB_00156d78;
                }
              }
              else if (0xffffd7ff < uVar9 - 0x10000 && 0x1ffd < uVar9 - 0xe000) goto LAB_00156d71;
LAB_0015643c:
              iVar10 = xmlCopyCharMultiByte(pxVar24 + local_80,uVar9);
              sVar1 = (long)iVar10 + local_80;
              lVar22 = (long)iVar10 + local_80;
              local_80 = sVar1;
              if ((lVar22 + 100U <= local_68) ||
                 ((uVar23 = local_68 * 2 + 100, local_68 <= uVar23 &&
                  (pxVar12 = (xmlChar *)(*xmlRealloc)(pxVar24,uVar23), local_68 = uVar23,
                  pxVar12 != (xmlChar *)0x0)))) goto LAB_001564e2;
            }
            else {
              if ((local_58 & 1) == 0) goto LAB_00156114;
              piVar13 = __xmlParserDebugEntities();
              if (*piVar13 != 0) {
                pp_Var14 = __xmlGenericError();
                p_Var5 = *pp_Var14;
                ppvVar15 = __xmlGenericErrorContext();
                (*p_Var5)(*ppvVar15,"String decoding Entity Reference: %.30s\n",str);
              }
              ctxt = local_50;
              local_60 = str;
              if (*str != '&') goto LAB_001564d4;
              local_60 = str + 1;
              pxVar20 = xmlParseStringName(local_50,&local_60);
              if (pxVar20 == (xmlChar *)0x0) {
                pcVar19 = "xmlParseStringEntityRef: no name\n";
                goto LAB_001562e8;
              }
              if (*local_60 != ';') goto LAB_0015628c;
              pxVar21 = local_60 + 1;
              if (((ctxt->options & 0x100000) == 0) &&
                 (pxVar16 = xmlGetPredefinedEntity(pxVar20), pxVar16 != (xmlEntityPtr)0x0)) {
                (*xmlFree)(pxVar20);
                xmlParserEntityCheck(ctxt,0,pxVar16,0);
              }
              else {
                ctxt->nbentities = ctxt->nbentities + 1;
                if (ctxt->sax == (_xmlSAXHandler *)0x0) {
LAB_00156382:
                  pxVar16 = (xmlEntityPtr)0x0;
                }
                else {
                  p_Var6 = ctxt->sax->getEntity;
                  if (((p_Var6 == (getEntitySAXFunc)0x0) ||
                      (pxVar16 = (*p_Var6)(ctxt->userData,pxVar20), pxVar16 == (xmlEntityPtr)0x0))
                     && (((ctxt->options & 0x100000) == 0 ||
                         (pxVar16 = xmlGetPredefinedEntity(pxVar20), pxVar16 == (xmlEntityPtr)0x0)))
                     ) {
                    if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_00156382;
                    pxVar16 = xmlSAX2GetEntity(ctxt,pxVar20);
                  }
                }
                xVar3 = ctxt->instate;
                if (xVar3 == XML_PARSER_EOF) {
                  (*xmlFree)(pxVar20);
                  goto LAB_001564d4;
                }
                if (pxVar16 == (xmlEntityPtr)0x0) {
                  if ((ctxt->standalone == 1) ||
                     ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                    xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",
                                      pxVar20);
                  }
                  else {
                    xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",
                                 pxVar20);
                  }
                  xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                }
                else {
                  xVar11 = pxVar16->etype;
                  if (xVar11 == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
                    error = XML_ERR_UNPARSED_ENTITY;
                    pcVar19 = "Entity reference to unparsed entity %s\n";
                  }
                  else if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                          (xVar11 == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
                    error = XML_ERR_ENTITY_IS_EXTERNAL;
                    pcVar19 = "Attribute references external entity \'%s\'\n";
                  }
                  else {
                    if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                       (xVar11 != XML_INTERNAL_PREDEFINED_ENTITY &&
                        pxVar16->content != (xmlChar *)0x0)) {
                      pxVar17 = xmlStrchr(pxVar16->content,'<');
                      if (pxVar17 != (xmlChar *)0x0) {
                        error = XML_ERR_LT_IN_ATTRIBUTE;
                        pcVar19 = "\'<\' in entity \'%s\' is not allowed in attributes values\n";
                        goto LAB_001569c8;
                      }
                      xVar11 = pxVar16->etype;
                    }
                    if ((xVar11 & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY)
                    goto LAB_001569d0;
                    error = XML_ERR_ENTITY_IS_PARAMETER;
                    pcVar19 = "Attempt to reference the parameter entity \'%s\'\n";
                  }
LAB_001569c8:
                  xmlFatalErrMsgStr(ctxt,error,pcVar19,pxVar20);
                }
LAB_001569d0:
                (*xmlFree)(pxVar20);
                xmlParserEntityCheck(ctxt,0,pxVar16,0);
                str = pxVar21;
                if (pxVar16 == (xmlEntityPtr)0x0) goto LAB_001564e2;
              }
              ctxt->nbentities = ctxt->nbentities + (long)(pxVar16->checked / 2);
              str_00 = pxVar16->content;
              if (pxVar16->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if (str_00 != (byte *)0x0) {
                  uVar9 = (uint)*str_00;
                  str = pxVar21;
                  goto LAB_0015643c;
                }
                xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,"predefined entity has no content\n");
                goto LAB_00156cfa;
              }
              if (str_00 != (byte *)0x0) {
                ctxt->depth = ctxt->depth + 1;
                iVar10 = xmlStrlen(str_00);
                str2 = (xmlChar *)0x0;
                pxVar20 = xmlStringLenDecodeEntities(ctxt,str_00,iVar10,local_58,'\0','\0','\0');
                ctxt->depth = ctxt->depth + -1;
                if (pxVar20 != (xmlChar *)0x0) {
                  xVar2 = *pxVar20;
                  pxVar12 = pxVar20;
                  pxVar7 = local_40;
                  while (local_40 = pxVar16, xVar2 != '\0') {
                    pxVar12 = pxVar12 + 1;
                    pxVar24[local_80] = xVar2;
                    uVar23 = local_68;
                    pxVar17 = pxVar24;
                    if (local_68 < local_80 + 0x65) {
                      iVar10 = xmlParserEntityCheck(ctxt,local_80 + 1,local_40,0);
                      if (iVar10 != 0) goto LAB_00156ce9;
                      uVar23 = local_68 * 2 + 100;
                      if ((uVar23 < local_68) ||
                         (pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar24,uVar23),
                         pxVar17 == (xmlChar *)0x0)) goto LAB_00156cdf;
                    }
                    pxVar16 = local_40;
                    pxVar24 = pxVar17;
                    local_80 = local_80 + 1;
                    local_68 = uVar23;
                    pxVar7 = local_40;
                    xVar2 = *pxVar12;
                  }
LAB_00156cbd:
                  local_40 = pxVar7;
                  (*xmlFree)(pxVar20);
                  str = pxVar21;
                  pxVar12 = pxVar24;
                  goto LAB_001564e2;
                }
                *pxVar16->content = '\0';
                goto LAB_00156cfa;
              }
              iVar10 = xmlStrlen(pxVar16->name);
              pxVar20 = pxVar16->name;
              pxVar24[local_80] = '&';
              if (local_80 + (long)iVar10 + 0x65 <= local_68) {
LAB_00156b9a:
                lVar22 = local_80 + 1;
                if (0 < iVar10) {
                  uVar9 = iVar10 + 1;
                  do {
                    xVar2 = *pxVar20;
                    pxVar20 = pxVar20 + 1;
                    pxVar12[lVar22] = xVar2;
                    lVar22 = lVar22 + 1;
                    uVar9 = uVar9 - 1;
                  } while (1 < uVar9);
                }
                pxVar12[lVar22] = ';';
                str = pxVar21;
                local_80 = lVar22 + 1;
                goto LAB_001564e2;
              }
              uVar23 = (long)iVar10 + local_68 * 2 + 100;
              if (uVar23 < local_68) {
                pxVar20 = (xmlChar *)0x0;
                goto LAB_00156cdf;
              }
              pxVar12 = (xmlChar *)(*xmlRealloc)(pxVar24,uVar23);
              local_68 = uVar23;
              if (pxVar12 != (xmlChar *)0x0) goto LAB_00156b9a;
            }
            pxVar20 = (xmlChar *)0x0;
            goto LAB_00156cdf;
          }
          if (((local_58 & 2) == 0) || (uVar9 != 0x25)) {
LAB_00156114:
            if (local_54 == 1) {
              pxVar24[local_80] = (xmlChar)uVar9;
              local_80 = local_80 + 1;
            }
            else {
              iVar10 = xmlCopyCharMultiByte(pxVar24 + local_80,uVar9);
              local_80 = local_80 + (long)iVar10;
            }
            str = str + local_54;
            if ((local_68 < local_80 + 100) &&
               ((uVar23 = local_68 * 2 + 100, uVar23 < local_68 ||
                (pxVar12 = (xmlChar *)(*xmlRealloc)(pxVar24,uVar23), local_68 = uVar23,
                pxVar12 == (xmlChar *)0x0)))) {
              pxVar20 = (xmlChar *)0x0;
              goto LAB_00156cdf;
            }
          }
          else {
            piVar13 = __xmlParserDebugEntities();
            if (*piVar13 != 0) {
              pp_Var14 = __xmlGenericError();
              p_Var5 = *pp_Var14;
              ppvVar15 = __xmlGenericErrorContext();
              (*p_Var5)(*ppvVar15,"String decoding PE Reference: %.30s\n",str);
              ctxt = local_50;
            }
            if (str == (xmlChar *)0x0) {
              str = (xmlChar *)0x0;
            }
            else {
              local_60 = str;
              if (*str == '%') {
                local_60 = str + 1;
                pxVar20 = xmlParseStringName(ctxt,&local_60);
                pxVar21 = local_60;
                if (pxVar20 == (xmlChar *)0x0) {
                  pcVar19 = "xmlParseStringPEReference: no name\n";
LAB_001562e8:
                  xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,pcVar19);
                  str = local_60;
                }
                else {
                  if (*local_60 == ';') {
                    ctxt->nbentities = ctxt->nbentities + 1;
                    if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                       (p_Var4 = ctxt->sax->getParameterEntity,
                       p_Var4 == (getParameterEntitySAXFunc)0x0)) {
                      pxVar16 = (xmlEntityPtr)0x0;
                    }
                    else {
                      pxVar16 = (*p_Var4)(ctxt->userData,pxVar20);
                    }
                    pxVar21 = pxVar21 + 1;
                    if (ctxt->instate != XML_PARSER_EOF) {
                      if (pxVar16 == (xmlEntityPtr)0x0) {
                        if ((ctxt->standalone == 1) ||
                           ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                          xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,
                                            "PEReference: %%%s; not found\n",pxVar20);
                        }
                        else {
                          xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,
                                        "PEReference: %%%s; not found\n",pxVar20,str2);
                          ctxt->valid = 0;
                        }
                        xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                      }
                      else if ((pxVar16->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                               XML_INTERNAL_PARAMETER_ENTITY) {
                        xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,
                                      "%%%s; is not a parameter entity\n",pxVar20,str2);
                      }
                      ctxt->hasPErefs = 1;
                      (*xmlFree)(pxVar20);
                      xmlParserEntityCheck(ctxt,0,pxVar16,0);
                      str = pxVar21;
                      if (pxVar16 == (xmlEntityPtr)0x0) goto LAB_001564e2;
                      ctxt->nbentities = ctxt->nbentities + (long)(pxVar16->checked / 2);
                      if (pxVar16->content == (xmlChar *)0x0) {
                        if (((ctxt->options & 0x12) == 0) && (ctxt->validate == 0)) {
                          xmlWarningMsg(ctxt,XML_ERR_ENTITY_PROCESSING,
                                        "not validating will not read content for PE entity %s\n",
                                        pxVar16->name,str2);
                        }
                        else {
                          if ((pxVar16->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                             (pxVar16->etype == XML_EXTERNAL_PARAMETER_ENTITY)) {
                            piVar13 = __xmlParserDebugEntities();
                            if (*piVar13 != 0) {
                              pp_Var14 = __xmlGenericError();
                              p_Var5 = *pp_Var14;
                              ppvVar15 = __xmlGenericErrorContext();
                              (*p_Var5)(*ppvVar15,"Reading %s entity content input\n",pxVar16->name)
                              ;
                              ctxt = local_50;
                            }
                            buf = xmlBufferCreate();
                            if (buf != (xmlBufferPtr)0x0) {
                              xmlBufferSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
                              input = xmlNewEntityInputStream(ctxt,pxVar16);
                              if (input == (xmlParserInputPtr)0x0) {
                                xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,
                                            "xmlLoadEntityContent input error");
                              }
                              else {
                                iVar10 = xmlPushInput(ctxt,input);
                                if (iVar10 < 0) {
                                  xmlBufferFree(buf);
                                  xmlFreeInputStream(input);
                                  goto LAB_00156bf6;
                                }
                                if ((ctxt->progressive == 0) &&
                                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                  xmlGROW(ctxt);
                                }
                                uVar9 = xmlCurrentChar(ctxt,(int *)&local_60);
                                pxVar18 = ctxt->input;
                                if (pxVar18 == input) {
                                  iVar10 = 0;
                                  do {
                                    if (pxVar18->end <= pxVar18->cur) {
                                      xmlPopInput(ctxt);
                                      goto LAB_00156bdd;
                                    }
                                    if ((int)uVar9 < 0x100) {
                                      if (((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0))
                                         && ((int)uVar9 < 0x20)) goto LAB_001566db;
                                    }
                                    else if (0xfffff < uVar9 - 0x10000 &&
                                             (0x1ffd < uVar9 - 0xe000 && 0xd7ff < uVar9)) {
                                      bVar26 = false;
                                      bVar25 = false;
                                      goto LAB_0015697a;
                                    }
                                    xmlBufferAdd(buf,pxVar18->cur,(int)local_60);
                                    if (iVar10 < 0x65) {
                                      iVar10 = iVar10 + 1;
                                    }
                                    else {
                                      if ((ctxt->progressive == 0) &&
                                         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                        xmlGROW(ctxt);
                                      }
                                      iVar10 = 0;
                                      if (ctxt->instate == XML_PARSER_EOF) goto LAB_00156bee;
                                    }
                                    pxVar18 = ctxt->input;
                                    if (*pxVar18->cur == '\n') {
                                      pxVar18->line = pxVar18->line + 1;
                                      pxVar18->col = 1;
                                    }
                                    else {
                                      pxVar18->col = pxVar18->col + 1;
                                    }
                                    pxVar18->cur = pxVar18->cur + (int)local_60;
                                    uVar9 = xmlCurrentChar(ctxt,(int *)&local_60);
                                    if (uVar9 == 0) {
                                      if ((ctxt->progressive == 0) &&
                                         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                        xmlGROW(ctxt);
                                      }
                                      if (ctxt->instate == XML_PARSER_EOF) goto LAB_00156bee;
                                      uVar9 = xmlCurrentChar(ctxt,(int *)&local_60);
                                      iVar10 = 0;
                                    }
                                    pxVar18 = ctxt->input;
                                  } while (pxVar18 == input);
                                }
                                if ((int)uVar9 < 0x100) {
                                  if ((int)uVar9 < 0x20) {
LAB_001566db:
                                    if ((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0))
                                    goto LAB_00156991;
                                  }
                                }
                                else {
                                  bVar25 = uVar9 - 0xe000 < 0x1ffe;
                                  bVar26 = uVar9 - 0x10000 < 0x100000;
LAB_0015697a:
                                  if (!(bool)(bVar26 | bVar25 | uVar9 < 0xd800)) {
LAB_00156991:
                                    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                                                                                            
                                                  "xmlLoadEntityContent: invalid char value %d\n",
                                                  uVar9);
                                    goto LAB_00156bee;
                                  }
                                }
LAB_00156bdd:
                                pxVar16->content = buf->content;
                                buf->content = (xmlChar *)0x0;
                              }
LAB_00156bee:
                              xmlBufferFree(buf);
                              goto LAB_00156bf6;
                            }
                          }
                          xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,
                                      "xmlLoadEntityContent parameter error");
                        }
                      }
LAB_00156bf6:
                      ctxt->depth = ctxt->depth + 1;
                      str2 = (xmlChar *)0x0;
                      pxVar20 = xmlStringDecodeEntities
                                          (ctxt,pxVar16->content,local_58,'\0','\0','\0');
                      ctxt->depth = ctxt->depth + -1;
                      if (pxVar20 != (xmlChar *)0x0) {
                        xVar2 = *pxVar20;
                        pxVar12 = pxVar20;
                        while (pxVar7 = local_40, xVar2 != '\0') {
                          pxVar12 = pxVar12 + 1;
                          pxVar24[local_80] = xVar2;
                          uVar23 = local_68;
                          pxVar17 = pxVar24;
                          if (local_68 < local_80 + 0x65) {
                            iVar10 = xmlParserEntityCheck(ctxt,local_80 + 1,pxVar16,0);
                            if (iVar10 != 0) goto LAB_00156ce9;
                            uVar23 = local_68 * 2 + 100;
                            if ((uVar23 < local_68) ||
                               (pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar24,uVar23),
                               pxVar17 == (xmlChar *)0x0)) goto LAB_00156cdf;
                          }
                          pxVar24 = pxVar17;
                          local_80 = local_80 + 1;
                          local_68 = uVar23;
                          xVar2 = *pxVar12;
                        }
                        goto LAB_00156cbd;
                      }
                      if (pxVar16->content != (xmlChar *)0x0) {
                        *pxVar16->content = '\0';
                      }
                      goto LAB_00156cfa;
                    }
                  }
                  else {
LAB_0015628c:
                    pxVar21 = local_60;
                    xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
                  }
                  (*xmlFree)(pxVar20);
                  str = pxVar21;
                }
              }
            }
LAB_001564d4:
            xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
          }
LAB_001564e2:
          uVar9 = 0;
          if (str < local_38) {
            uVar9 = xmlStringCurrentChar(ctxt,str,&local_54);
          }
          if ((((uVar9 == local_44) || (uVar9 == end2)) || (uVar9 == 0)) ||
             (pxVar24 = pxVar12, uVar9 == local_48)) break;
        }
      }
      pxVar12[local_80] = '\0';
      return pxVar12;
    }
    pxVar24 = (xmlChar *)0x0;
LAB_00156cdf:
    xmlErrMemory(ctxt,(char *)0x0);
LAB_00156ce9:
    if (pxVar20 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar20);
    }
LAB_00156cfa:
    if (pxVar24 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar24);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
		      int what, xmlChar end, xmlChar  end2, xmlChar end3) {
    xmlChar *buffer = NULL;
    size_t buffer_size = 0;
    size_t nbchars = 0;

    xmlChar *current = NULL;
    xmlChar *rep = NULL;
    const xmlChar *last;
    xmlEntityPtr ent;
    int c,l;

    if ((ctxt == NULL) || (str == NULL) || (len < 0))
	return(NULL);
    last = str + len;

    if (((ctxt->depth > 40) &&
         ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
	(ctxt->depth > 1024)) {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buffer_size = XML_PARSER_BIG_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     * we are operating on already parsed values.
     */
    if (str < last)
	c = CUR_SCHAR(str, l);
    else
        c = 0;
    while ((c != 0) && (c != end) && /* non input consuming loop */
           (c != end2) && (c != end3) &&
           (ctxt->instate != XML_PARSER_EOF)) {

	if (c == 0) break;
        if ((c == '&') && (str[1] == '#')) {
	    int val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0)
                goto int_error;
	    COPY_BUF(0,buffer,nbchars,val);
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	} else if ((c == '&') && (what & XML_SUBSTITUTE_REF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding Entity Reference: %.30s\n",
			str);
	    ent = xmlParseStringEntityRef(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content != NULL) {
		    COPY_BUF(0,buffer,nbchars,ent->content[0]);
		    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
			growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
		    }
		} else {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    goto int_error;
		}
	    } else if ((ent != NULL) && (ent->content != NULL)) {
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL) {
                    ent->content[0] = 0;
                    goto int_error;
                }

                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    } else if (ent != NULL) {
		int i = xmlStrlen(ent->name);
		const xmlChar *cur = ent->name;

		buffer[nbchars++] = '&';
		if (nbchars + i + XML_PARSER_BUFFER_SIZE > buffer_size) {
		    growBuffer(buffer, i + XML_PARSER_BUFFER_SIZE);
		}
		for (;i > 0;i--)
		    buffer[nbchars++] = *cur++;
		buffer[nbchars++] = ';';
	    }
	} else if (c == '%' && (what & XML_SUBSTITUTE_PEREF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding PE Reference: %.30s\n", str);
	    ent = xmlParseStringPEReference(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if (ent != NULL) {
                if (ent->content == NULL) {
		    /*
		     * Note: external parsed entities will not be loaded,
		     * it is not required for a non-validating parser to
		     * complete external PEReferences coming from the
		     * internal subset
		     */
		    if (((ctxt->options & XML_PARSE_NOENT) != 0) ||
			((ctxt->options & XML_PARSE_DTDVALID) != 0) ||
			(ctxt->validate != 0)) {
			xmlLoadEntityContent(ctxt, ent);
		    } else {
			xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
		  "not validating will not read content for PE entity %s\n",
		                      ent->name, NULL);
		    }
		}
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL) {
                    if (ent->content != NULL)
                        ent->content[0] = 0;
                    goto int_error;
                }
                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    }
	} else {
	    COPY_BUF(l,buffer,nbchars,c);
	    str += l;
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	}
	if (str < last)
	    c = CUR_SCHAR(str, l);
	else
	    c = 0;
    }
    buffer[nbchars] = 0;
    return(buffer);

mem_error:
    xmlErrMemory(ctxt, NULL);
int_error:
    if (rep != NULL)
        xmlFree(rep);
    if (buffer != NULL)
        xmlFree(buffer);
    return(NULL);
}